

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * reserve_buffer(flatcc_builder_t *B,int alloc_type,size_t used,size_t need,int zero_init)

{
  int iVar1;
  flatcc_iovec_t *pfVar2;
  flatcc_iovec_t *buf;
  int zero_init_local;
  size_t need_local;
  size_t used_local;
  int alloc_type_local;
  flatcc_builder_t *B_local;
  
  pfVar2 = B->buffers + alloc_type;
  if ((pfVar2->iov_len < used + need) &&
     (iVar1 = (*B->alloc)(B->alloc_context,pfVar2,used + need,zero_init,alloc_type), iVar1 != 0)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x13c,"void *reserve_buffer(flatcc_builder_t *, int, size_t, size_t, int)");
  }
  return (void *)((long)pfVar2->iov_base + used);
}

Assistant:

static inline void *reserve_buffer(flatcc_builder_t *B, int alloc_type, size_t used, size_t need, int zero_init)
{
    iovec_t *buf = B->buffers + alloc_type;

    if (used + need > buf->iov_len) {
        if (B->alloc(B->alloc_context, buf, used + need, zero_init, alloc_type)) {
            check(0, "memory allocation failed");
            return 0;
        }
    }
    return (void *)((size_t)buf->iov_base + used);
}